

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello-imgui.cpp
# Opt level: O3

void keyboardCallback(GLFWwindow *window,int key,int scancode,int action,int modsls)

{
  ImGuiIO *pIVar1;
  
  pIVar1 = ImGui::GetIO();
  if ((pIVar1->WantCaptureKeyboard == false) && (key == 0x100 && action == 1)) {
    glfwSetWindowShouldClose(window,1);
    return;
  }
  return;
}

Assistant:

void
keyboardCallback(
	GLFWwindow* window,
	int key, int scancode, int action, int modsls
) {
	ImGuiIO& io = ImGui::GetIO();
	if (io.WantCaptureKeyboard)
		return;

	if (action == GLFW_PRESS) {
		switch (key) {
			case GLFW_KEY_ESCAPE:
				glfwSetWindowShouldClose(window, GL_TRUE);
			break;
			default: break;
		}
	}
}